

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void obfree(obj *obj,obj *merge)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  short sVar5;
  monst *shkp;
  bill_x *pbVar6;
  bill_x *pbVar7;
  
  if ((obj->otyp == 0xf1) && (obj->corpsenm != 0)) {
    o_unleash(obj);
  }
  cVar4 = obj->oclass;
  if (cVar4 == '\a') {
    food_disappears(obj);
    cVar4 = obj->oclass;
  }
  if (cVar4 == '\n') {
    book_disappears(obj);
  }
  if (obj->cobj != (obj *)0x0) {
    delete_contents(obj);
  }
  if ((obj->field_0x4a & 4) == 0) {
LAB_0022ae48:
    shkp = shop_keeper(level,u.ushops[0]);
  }
  else {
    shkp = (monst *)&level->monlist;
    do {
      shkp = next_shkp(shkp->nmon,'\x01');
      if (shkp == (monst *)0x0) goto LAB_0022ae48;
      pbVar6 = onbill(obj,shkp,'\x01');
    } while (pbVar6 == (bill_x *)0x0);
  }
  pbVar6 = onbill(obj,shkp,'\0');
  if (pbVar6 != (bill_x *)0x0) {
    if (merge == (obj *)0x0) {
      pbVar6->useup = '\x01';
      obj->field_0x4a = obj->field_0x4a & 0xfb;
      add_to_billobjs(obj);
      return;
    }
    pbVar7 = onbill(merge,shkp,'\0');
    if (pbVar7 == (bill_x *)0x0) {
      warning("obfree: not on bill??");
      return;
    }
    pbVar7->bquan = pbVar7->bquan + pbVar6->bquan;
    sVar5 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2) + -1;
    *(short *)((long)&shkp[0x1b].misc_worn_check + 2) = sVar5;
    puVar1 = (undefined8 *)(*(long *)&shkp[0x1b].mnum + (long)sVar5 * 0x10);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    pbVar6->bo_id = (int)uVar2;
    pbVar6->useup = (char)((ulong)uVar2 >> 0x20);
    *(int3 *)&pbVar6->field_0x5 = (int3)((ulong)uVar2 >> 0x28);
    pbVar6->price = (int)uVar3;
    pbVar6->bquan = (int)((ulong)uVar3 >> 0x20);
  }
  if (uwep == obj) {
    uwepgone();
  }
  if (uswapwep == obj) {
    uswapwepgone();
  }
  if (uquiver == obj) {
    uqwepgone();
  }
  dealloc_obj(obj);
  return;
}

Assistant:

void obfree(struct obj *obj, struct obj *merge)
{
	struct bill_x *bp;
	struct bill_x *bpm;
	struct monst *shkp;

	if (obj->otyp == LEASH && obj->leashmon) o_unleash(obj);
	if (obj->oclass == FOOD_CLASS) food_disappears(obj);
	if (obj->oclass == SPBOOK_CLASS) book_disappears(obj);
	if (Has_contents(obj)) delete_contents(obj);

	shkp = 0;
	if (obj->unpaid) {
	    /* look for a shopkeeper who owns this object */
	    for (shkp = next_shkp(level->monlist, TRUE); shkp;
		    shkp = next_shkp(shkp->nmon, TRUE))
		if (onbill(obj, shkp, TRUE)) break;
	}
	/* sanity check, more or less */
	if (!shkp) shkp = shop_keeper(level, *u.ushops);
		/*
		 * Note:  `shkp = shop_keeper(level, *u.ushops)' used to be
		 *	  unconditional.  But obfree() is used all over
		 *	  the place, so making its behavior be dependent
		 *	  upon player location doesn't make much sense.
		 */

	if ((bp = onbill(obj, shkp, FALSE)) != 0) {
		if (!merge){
			bp->useup = 1;
			obj->unpaid = 0;	/* only for doinvbill */
			add_to_billobjs(obj);
			return;
		}
		bpm = onbill(merge, shkp, FALSE);
		if (!bpm){
			/* this used to be a rename */
			warning("obfree: not on bill??");
			return;
		} else {
			/* this was a merger */
			bpm->bquan += bp->bquan;
			ESHK(shkp)->billct--;
			*bp = ESHK(shkp)->bill_p[ESHK(shkp)->billct];
			
		}
	}
	
	if (obj == uwep) uwepgone();
	if (obj == uswapwep) uswapwepgone();
	if (obj == uquiver) uqwepgone();
	
	dealloc_obj(obj);
}